

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

TStatus luaD_rawrunprotected(lua_State *L,Pfunc f,void *ud)

{
  l_uint32 lVar1;
  int iVar2;
  lua_longjmp lj;
  lua_longjmp local_f8;
  
  lVar1 = L->nCcalls;
  local_f8.status = '\0';
  local_f8.previous = L->errorJmp;
  L->errorJmp = &local_f8;
  iVar2 = _setjmp((__jmp_buf_tag *)local_f8.b);
  if (iVar2 == 0) {
    (*f)(L,ud);
  }
  L->errorJmp = local_f8.previous;
  L->nCcalls = lVar1;
  return local_f8.status;
}

Assistant:

TStatus luaD_rawrunprotected (lua_State *L, Pfunc f, void *ud) {
  l_uint32 oldnCcalls = L->nCcalls;
  struct lua_longjmp lj;
  lj.status = LUA_OK;
  lj.previous = L->errorJmp;  /* chain new error handler */
  L->errorJmp = &lj;
  LUAI_TRY(L, &lj, f, ud);  /* call 'f' catching errors */
  L->errorJmp = lj.previous;  /* restore old error handler */
  L->nCcalls = oldnCcalls;
  return lj.status;
}